

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O0

FabArray<amrex::TagBox> * __thiscall
amrex::FabArray<amrex::TagBox>::operator=
          (FabArray<amrex::TagBox> *this,FabArray<amrex::TagBox> *rhs)

{
  FabArray<amrex::TagBox> *in_RSI;
  FabArray<amrex::TagBox> *in_RDI;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *unaff_retaddr;
  FabArray<amrex::TagBox> *in_stack_00000030;
  FabArray<amrex::TagBox> *__b;
  
  if (in_RSI != in_RDI) {
    __b = in_RDI;
    clear(in_stack_00000030);
    FabArrayBase::operator=(&in_RSI->super_FabArrayBase,&in_RDI->super_FabArrayBase);
    std::
    unique_ptr<amrex::FabFactory<amrex::TagBox>,_std::default_delete<amrex::FabFactory<amrex::TagBox>_>_>
    ::operator=((unique_ptr<amrex::FabFactory<amrex::TagBox>,_std::default_delete<amrex::FabFactory<amrex::TagBox>_>_>
                 *)in_RSI,
                (unique_ptr<amrex::FabFactory<amrex::TagBox>,_std::default_delete<amrex::FabFactory<amrex::TagBox>_>_>
                 *)in_RDI);
    (in_RDI->m_dallocator).m_arena = (in_RSI->m_dallocator).m_arena;
    in_RDI->define_function_called = (bool)(in_RSI->define_function_called & 1);
    std::swap<amrex::TagBox*,std::allocator<amrex::TagBox*>>
              ((vector<amrex::TagBox_*,_std::allocator<amrex::TagBox_*>_> *)in_RSI,
               (vector<amrex::TagBox_*,_std::allocator<amrex::TagBox_*>_> *)in_RDI);
    std::swap<void*>(&in_RDI->m_hp_arrays,&in_RSI->m_hp_arrays);
    (in_RDI->m_arrays).hp = (in_RSI->m_arrays).hp;
    (in_RDI->m_const_arrays).hp = (in_RSI->m_const_arrays).hp;
    std::swap<amrex::Vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (unaff_retaddr,
               (Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)__b);
    ShMem::operator=(&in_RDI->shmem,&in_RSI->shmem);
    in_RSI->define_function_called = false;
    std::vector<amrex::TagBox_*,_std::allocator<amrex::TagBox_*>_>::clear
              ((vector<amrex::TagBox_*,_std::allocator<amrex::TagBox_*>_> *)0x136cb70);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x136cb81);
    clear(in_stack_00000030);
  }
  return in_RDI;
}

Assistant:

FabArray<FAB>&
FabArray<FAB>::operator= (FabArray<FAB>&& rhs) noexcept
{
    if (&rhs != this)
    {
        clear();

        FabArrayBase::operator=(std::move(rhs));
        m_factory = std::move(rhs.m_factory);
        m_dallocator = std::move(rhs.m_dallocator);
        define_function_called = rhs.define_function_called;
        std::swap(m_fabs_v, rhs.m_fabs_v);
#ifdef AMREX_USE_GPU
        std::swap(m_dp_arrays, rhs.m_dp_arrays);
#endif
        std::swap(m_hp_arrays, rhs.m_hp_arrays);
        m_arrays = rhs.m_arrays;
        m_const_arrays = rhs.m_const_arrays;
        std::swap(m_tags, rhs.m_tags);
        shmem = std::move(rhs.shmem);

        rhs.define_function_called = false;
        rhs.m_fabs_v.clear();
        rhs.m_tags.clear();
        rhs.clear();
    }
    return *this;
}